

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

uint32_t __thiscall cfd::core::DescriptorNode::GetNeedArgumentNum(DescriptorNode *this)

{
  pointer pDVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  const_iterator __begin3;
  pointer this_00;
  
  uVar3 = this->need_arg_num_;
  this_00 = (this->child_node_).
            super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->child_node_).
           super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pDVar1) {
    for (; this_00 != pDVar1; this_00 = this_00 + 1) {
      uVar2 = GetNeedArgumentNum(this_00);
      uVar3 = uVar3 + uVar2;
    }
  }
  return uVar3;
}

Assistant:

uint32_t DescriptorNode::GetNeedArgumentNum() const {
  uint32_t result = need_arg_num_;
  if (!child_node_.empty()) {
    for (const auto& child : child_node_) {
      result += child.GetNeedArgumentNum();
    }
  }
  return result;
}